

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
cs::method_import::preprocess
          (method_import *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  bool bVar1;
  int iVar2;
  const_reference pptVar3;
  token_base **pptVar4;
  undefined8 uVar5;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  *var_list_00;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_00;
  undefined8 in_RSI;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  *in_RDI;
  tree_type<cs::token_base_*> *t;
  iterator __end2;
  iterator __begin2;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range2;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *parallel_list;
  anon_class_16_2_05505a5e process;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  var_list;
  tree_type<cs::token_base_*> *tree;
  _Self *in_stack_fffffffffffffe78;
  internal_error *in_stack_fffffffffffffe80;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *this_01;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffe90;
  token_base *in_stack_fffffffffffffe98;
  iterator in_stack_fffffffffffffea0;
  statement_import *this_02;
  iterator *in_stack_fffffffffffffec0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  *in_stack_fffffffffffffec8;
  allocator *paVar6;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *local_f8;
  reference local_f0;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffff18;
  anon_class_16_2_05505a5e *in_stack_ffffffffffffff20;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_c8;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_a8;
  tree_node *local_a0;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_98;
  tree_node *local_90;
  undefined8 local_88;
  statement_import *local_80;
  undefined1 local_78 [48];
  string local_48 [32];
  tree_node *local_28;
  tree_type<cs::token_base_*> *local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_fffffffffffffe90);
  pptVar3 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
  local_20 = token_expr::get_tree((token_expr *)*pptVar3);
  local_28 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe78);
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffec0);
  if (*pptVar4 != (token_base *)0x0) {
    this_02 = (statement_import *)local_78;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
              *)0x24bc9e);
    local_88 = local_10;
    local_80 = this_02;
    local_90 = (tree_node *)
               tree_type<cs::token_base_*>::root
                         ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe78);
    var_list_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
                   *)tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffec0);
    iVar2 = (*(*(_func_int ***)
                &((var_list_00->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->first)[2])();
    if (iVar2 == 0xf) {
      in_stack_fffffffffffffea0 =
           tree_type<cs::token_base_*>::root
                     ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe78);
      local_a0 = in_stack_fffffffffffffea0.mData;
      in_stack_fffffffffffffe98 =
           (token_base *)tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffec0);
      local_a8 = token_parallel::get_parallel
                           ((token_parallel *)in_stack_fffffffffffffe98->_vptr_token_base);
      local_98 = local_a8;
      std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               *)in_stack_fffffffffffffe78);
      std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             *)in_stack_fffffffffffffe78);
      while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78),
            bVar1) {
        local_f0 = std::
                   _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                   ::operator*(&local_c8);
        preprocess::anon_class_16_2_05505a5e::operator()
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        std::
        _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
        ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                      *)in_stack_fffffffffffffe80);
      }
    }
    else {
      preprocess::anon_class_16_2_05505a5e::operator()
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
    this_00 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
              statement_base::operator_new((size_t)in_stack_fffffffffffffe80);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
    ::vector(in_RDI,in_stack_fffffffffffffec8);
    this_01 = (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
              &stack0xfffffffffffffee0;
    std::shared_ptr<cs::context_type>::shared_ptr
              ((shared_ptr<cs::context_type> *)this_01,
               (shared_ptr<cs::context_type> *)in_stack_fffffffffffffe78);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             *)this_00);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_00);
    statement_import::statement_import
              (this_02,var_list_00,(context_t *)in_stack_fffffffffffffea0.mData,
               in_stack_fffffffffffffe98);
    local_f8 = this_00;
    std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
    emplace_back<cs::statement_import*>(this_01,(statement_import **)in_stack_fffffffffffffe78);
    std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x24bec4);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
               *)this_00);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
               *)this_00);
    return;
  }
  local_78[0x1b] = 1;
  uVar5 = __cxa_allocate_exception(0x28);
  paVar6 = (allocator *)(local_78 + 0x2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Null pointer accessed.",paVar6);
  internal_error::internal_error(in_stack_fffffffffffffe80,(string *)in_stack_fffffffffffffe78);
  local_78[0x1b] = 0;
  __cxa_throw(uVar5,&internal_error::typeinfo,internal_error::~internal_error);
}

Assistant:

void method_import::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		std::vector<std::pair<std::string, var>> var_list;
		auto process = [&context, &var_list](tree_type<token_base *> &t) {
			token_base *token = t.root().data();
			if (token == nullptr || token->get_type() != token_types::id)
				throw compile_error("Wrong grammar for import statement, expect <package name>");
			const var_id &package_name = static_cast<token_id *>(token)->get_id();
			const var &ext = make_namespace(context->instance->import(current_process->import_path, package_name));
			context->compiler->add_constant(ext);
			context->instance->storage.add_var_no_return(package_name, ext);
			var_list.emplace_back(package_name, ext);
		};
		if (tree.root().data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(tree.root().data())->get_parallel();
			for (auto &t: parallel_list)
				process(t);
		}
		else
			process(tree);
		mResult.emplace_back(new statement_import(var_list, context, raw.front().back()));
	}